

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::NeuralNetworkLayer::ByteSizeLong(NeuralNetworkLayer *this)

{
  uint uVar1;
  uint32 uVar2;
  string *value;
  Type *pTVar3;
  size_t sVar4;
  Type *pTVar5;
  size_t sVar6;
  ConvolutionLayerParams *pCVar7;
  ulong uVar8;
  uint i;
  int index;
  uint index_00;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  
  uVar1 = (this->input_).super_RepeatedPtrFieldBase.current_size_;
  uVar10 = (ulong)uVar1;
  uVar8 = 0;
  index = 0;
  if (0 < (int)uVar1) {
    uVar8 = uVar10;
    index = 0;
  }
  for (; (int)uVar8 != index; index = index + 1) {
    pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&(this->input_).super_RepeatedPtrFieldBase,index);
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(pTVar3);
    uVar10 = uVar10 + sVar4;
  }
  uVar1 = (this->output_).super_RepeatedPtrFieldBase.current_size_;
  lVar11 = uVar10 + uVar1;
  index_00 = 0;
  uVar9 = 0;
  if (0 < (int)uVar1) {
    uVar9 = uVar1;
  }
  for (; uVar9 != index_00; index_00 = index_00 + 1) {
    pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&(this->output_).super_RepeatedPtrFieldBase,index_00);
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(pTVar3);
    lVar11 = lVar11 + sVar4;
  }
  uVar1 = (this->inputtensor_).super_RepeatedPtrFieldBase.current_size_;
  lVar11 = lVar11 + (ulong)uVar1;
  for (uVar9 = 0; uVar1 != uVar9; uVar9 = uVar9 + 1) {
    pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                       (&(this->inputtensor_).super_RepeatedPtrFieldBase,uVar9);
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::Tensor>(pTVar5);
    lVar11 = lVar11 + sVar4;
  }
  uVar1 = (this->outputtensor_).super_RepeatedPtrFieldBase.current_size_;
  sVar4 = lVar11 + (ulong)uVar1;
  for (uVar9 = 0; uVar1 != uVar9; uVar9 = uVar9 + 1) {
    pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                       (&(this->outputtensor_).super_RepeatedPtrFieldBase,uVar9);
    sVar6 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::Tensor>(pTVar5);
    sVar4 = sVar4 + sVar6;
  }
  value = (this->name_).ptr_;
  if (value->_M_string_length != 0) {
    sVar6 = google::protobuf::internal::WireFormatLite::StringSize(value);
    sVar4 = sVar4 + sVar6 + 1;
  }
  sVar6 = sVar4 + 2;
  if (this->isupdatable_ == false) {
    sVar6 = sVar4;
  }
  uVar2 = this->_oneof_case_[0];
  switch(uVar2) {
  case 0x5af:
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::CumSumLayerParams>((this->layer_).cumsum_);
    break;
  case 0x5b0:
  case 0x5b1:
  case 0x5b2:
  case 0x5b3:
  case 0x5b6:
  case 0x5b7:
  case 0x5b8:
  case 0x5bb:
  case 0x5bc:
  case 0x5bd:
    goto switchD_001a8ce6_caseD_3b2;
  case 0x5b4:
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::ClampedReLULayerParams>
                      ((this->layer_).clampedrelu_);
    break;
  case 0x5b5:
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::ArgSortLayerParams>((this->layer_).argsort_)
    ;
    break;
  case 0x5b9:
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::Pooling3DLayerParams>
                      ((this->layer_).pooling3d_);
    break;
  case 0x5ba:
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::GlobalPooling3DLayerParams>
                      ((this->layer_).globalpooling3d_);
    break;
  case 0x5be:
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::SliceBySizeLayerParams>
                      ((this->layer_).slicebysize_);
    break;
  case 0x5bf:
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::Convolution3DLayerParams>
                      ((this->layer_).convolution3d_);
    break;
  default:
    switch(uVar2) {
    case 0x339:
    case 0x33b:
    case 0x33e:
    case 0x340:
      goto switchD_001a8cac_caseD_339;
    case 0x33a:
    case 0x33c:
    case 0x33d:
    case 0x33f:
      goto switchD_001a8ce6_caseD_3b2;
    }
    switch(uVar2) {
    case 0x3b1:
      sVar4 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::ScatterNDLayerParams>
                        ((this->layer_).scatternd_);
      break;
    case 0x3b2:
    case 0x3b3:
    case 0x3b4:
    case 0x3b5:
    case 0x3b7:
    case 0x3b9:
      goto switchD_001a8ce6_caseD_3b2;
    case 0x3b6:
      sVar4 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::SoftmaxNDLayerParams>
                        ((this->layer_).softmaxnd_);
      break;
    case 0x3b8:
      sVar4 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::GatherAlongAxisLayerParams>
                        ((this->layer_).gatheralongaxis_);
      break;
    case 0x3ba:
      sVar4 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::ScatterAlongAxisLayerParams>
                        ((this->layer_).scatteralongaxis_);
      break;
    default:
      if (uVar2 == 0x5aa) {
        sVar4 = google::protobuf::internal::WireFormatLite::
                MessageSizeNoVirtual<CoreML::Specification::OneHotLayerParams>
                          ((this->layer_).onehot_);
      }
      else if (uVar2 == 0x78) {
        sVar4 = google::protobuf::internal::WireFormatLite::
                MessageSizeNoVirtual<CoreML::Specification::PoolingLayerParams>
                          ((this->layer_).pooling_);
      }
      else if (uVar2 == 0x82) {
        sVar4 = google::protobuf::internal::WireFormatLite::
                MessageSizeNoVirtual<CoreML::Specification::ActivationParams>
                          ((this->layer_).activation_);
      }
      else if (uVar2 == 0x8c) {
        sVar4 = google::protobuf::internal::WireFormatLite::
                MessageSizeNoVirtual<CoreML::Specification::InnerProductLayerParams>
                          ((this->layer_).innerproduct_);
      }
      else if (uVar2 == 0x96) {
        sVar4 = google::protobuf::internal::WireFormatLite::
                MessageSizeNoVirtual<CoreML::Specification::EmbeddingLayerParams>
                          ((this->layer_).embedding_);
      }
      else if (uVar2 == 0xa0) {
        sVar4 = google::protobuf::internal::WireFormatLite::
                MessageSizeNoVirtual<CoreML::Specification::BatchnormLayerParams>
                          ((this->layer_).batchnorm_);
      }
      else if (uVar2 == 0xa5) {
        sVar4 = google::protobuf::internal::WireFormatLite::
                MessageSizeNoVirtual<CoreML::Specification::MeanVarianceNormalizeLayerParams>
                          ((this->layer_).mvn_);
      }
      else {
        if (uVar2 == 0xaa) goto switchD_001a8cac_caseD_339;
        if (uVar2 == 0xaf) goto LAB_001a8c69;
        if (uVar2 == 0xb4) {
          sVar4 = google::protobuf::internal::WireFormatLite::
                  MessageSizeNoVirtual<CoreML::Specification::LRNLayerParams>((this->layer_).lrn_);
        }
        else if (uVar2 == 0xbe) {
          sVar4 = google::protobuf::internal::WireFormatLite::
                  MessageSizeNoVirtual<CoreML::Specification::CropLayerParams>((this->layer_).crop_)
          ;
        }
        else if (uVar2 == 200) {
          sVar4 = google::protobuf::internal::WireFormatLite::
                  MessageSizeNoVirtual<CoreML::Specification::PaddingLayerParams>
                            ((this->layer_).padding_);
        }
        else if (uVar2 == 0xd2) {
          sVar4 = google::protobuf::internal::WireFormatLite::
                  MessageSizeNoVirtual<CoreML::Specification::UpsampleLayerParams>
                            ((this->layer_).upsample_);
        }
        else if (uVar2 == 0xd3) {
          sVar4 = google::protobuf::internal::WireFormatLite::
                  MessageSizeNoVirtual<CoreML::Specification::ResizeBilinearLayerParams>
                            ((this->layer_).resizebilinear_);
        }
        else if (uVar2 == 0xd4) {
          sVar4 = google::protobuf::internal::WireFormatLite::
                  MessageSizeNoVirtual<CoreML::Specification::CropResizeLayerParams>
                            ((this->layer_).cropresize_);
        }
        else if (uVar2 == 0xdc) {
          sVar4 = google::protobuf::internal::WireFormatLite::
                  MessageSizeNoVirtual<CoreML::Specification::UnaryFunctionLayerParams>
                            ((this->layer_).unary_);
        }
        else {
          if ((uVar2 == 0xe6) || (uVar2 == 0xe7)) goto switchD_001a8cac_caseD_339;
          if (uVar2 == 0xf0) goto LAB_001a8c69;
          if (uVar2 == 0xf5) {
            sVar4 = google::protobuf::internal::WireFormatLite::
                    MessageSizeNoVirtual<CoreML::Specification::ScaleLayerParams>
                              ((this->layer_).scale_);
          }
          else if (uVar2 == 0xfa) {
            sVar4 = google::protobuf::internal::WireFormatLite::
                    MessageSizeNoVirtual<CoreML::Specification::BiasLayerParams>
                              ((this->layer_).bias_);
          }
          else {
            if ((uVar2 == 0x104) || (uVar2 == 0x105)) goto LAB_001a8c69;
            if (uVar2 == 0x10e) {
              pCVar7 = (this->layer_).convolution_;
              uVar8 = (ulong)((uint)(byte)(pCVar7->kernelsize_).current_size_ * 2);
LAB_001a8cc9:
              (pCVar7->kernelsize_).total_size_ = (int)uVar8;
              sVar6 = sVar6 + uVar8 + 3;
              goto switchD_001a8ce6_caseD_3b2;
            }
            if (uVar2 == 0x118) {
              sVar4 = google::protobuf::internal::WireFormatLite::
                      MessageSizeNoVirtual<CoreML::Specification::ReduceLayerParams>
                                ((this->layer_).reduce_);
            }
            else if (uVar2 == 0x122) {
              sVar4 = google::protobuf::internal::WireFormatLite::
                      MessageSizeNoVirtual<CoreML::Specification::LoadConstantLayerParams>
                                ((this->layer_).loadconstant_);
            }
            else if (uVar2 == 300) {
              sVar4 = google::protobuf::internal::WireFormatLite::
                      MessageSizeNoVirtual<CoreML::Specification::ReshapeLayerParams>
                                ((this->layer_).reshape_);
            }
            else if (uVar2 == 0x12d) {
              sVar4 = google::protobuf::internal::WireFormatLite::
                      MessageSizeNoVirtual<CoreML::Specification::FlattenLayerParams>
                                ((this->layer_).flatten_);
            }
            else if (uVar2 == 0x136) {
              sVar4 = google::protobuf::internal::WireFormatLite::
                      MessageSizeNoVirtual<CoreML::Specification::PermuteLayerParams>
                                ((this->layer_).permute_);
            }
            else {
              if (uVar2 == 0x140) {
                pCVar7 = (this->layer_).convolution_;
                uVar8 = (ulong)(byte)(pCVar7->kernelsize_).current_size_ * 3;
                goto LAB_001a8cc9;
              }
              if (uVar2 == 0x14a) {
                sVar4 = google::protobuf::internal::WireFormatLite::
                        MessageSizeNoVirtual<CoreML::Specification::SplitLayerParams>
                                  ((this->layer_).split_);
              }
              else if (uVar2 == 0x154) {
                sVar4 = google::protobuf::internal::WireFormatLite::
                        MessageSizeNoVirtual<CoreML::Specification::SequenceRepeatLayerParams>
                                  ((this->layer_).sequencerepeat_);
              }
              else if (uVar2 == 0x159) {
                sVar4 = google::protobuf::internal::WireFormatLite::
                        MessageSizeNoVirtual<CoreML::Specification::ReorganizeDataLayerParams>
                                  ((this->layer_).reorganizedata_);
              }
              else if (uVar2 == 0x15e) {
                sVar4 = google::protobuf::internal::WireFormatLite::
                        MessageSizeNoVirtual<CoreML::Specification::SliceLayerParams>
                                  ((this->layer_).slice_);
              }
              else if (uVar2 == 400) {
                sVar4 = google::protobuf::internal::WireFormatLite::
                        MessageSizeNoVirtual<CoreML::Specification::SimpleRecurrentLayerParams>
                                  ((this->layer_).simplerecurrent_);
              }
              else if (uVar2 == 0x19a) {
                sVar4 = google::protobuf::internal::WireFormatLite::
                        MessageSizeNoVirtual<CoreML::Specification::GRULayerParams>
                                  ((this->layer_).gru_);
              }
              else if (uVar2 == 0x1a4) {
                sVar4 = google::protobuf::internal::WireFormatLite::
                        MessageSizeNoVirtual<CoreML::Specification::UniDirectionalLSTMLayerParams>
                                  ((this->layer_).unidirectionallstm_);
              }
              else if (uVar2 == 0x1ae) {
                sVar4 = google::protobuf::internal::WireFormatLite::
                        MessageSizeNoVirtual<CoreML::Specification::BiDirectionalLSTMLayerParams>
                                  ((this->layer_).bidirectionallstm_);
              }
              else if (uVar2 == 500) {
                sVar4 = google::protobuf::internal::WireFormatLite::
                        MessageSizeNoVirtual<CoreML::Specification::CustomLayerParams>
                                  ((this->layer_).custom_);
              }
              else {
                if (uVar2 == 600) goto LAB_001a8c69;
                if (uVar2 == 0x25d) {
                  sVar4 = google::protobuf::internal::WireFormatLite::
                          MessageSizeNoVirtual<CoreML::Specification::BranchLayerParams>
                                    ((this->layer_).branch_);
                }
                else if (uVar2 == 0x267) {
                  sVar4 = google::protobuf::internal::WireFormatLite::
                          MessageSizeNoVirtual<CoreML::Specification::LoopLayerParams>
                                    ((this->layer_).loop_);
                }
                else {
                  if ((uVar2 == 0x26c) || (uVar2 == 0x271)) goto LAB_001a8c69;
                  if (uVar2 == 0x27b) {
                    sVar4 = google::protobuf::internal::WireFormatLite::
                            MessageSizeNoVirtual<CoreML::Specification::RangeStaticLayerParams>
                                      ((this->layer_).rangestatic_);
                  }
                  else if (uVar2 == 0x280) {
                    sVar4 = google::protobuf::internal::WireFormatLite::
                            MessageSizeNoVirtual<CoreML::Specification::RangeDynamicLayerParams>
                                      ((this->layer_).rangedynamic_);
                  }
                  else if (uVar2 == 0x294) {
                    sVar4 = google::protobuf::internal::WireFormatLite::
                            MessageSizeNoVirtual<CoreML::Specification::ClipLayerParams>
                                      ((this->layer_).clip_);
                  }
                  else {
                    if (((((uVar2 == 0x299) || (uVar2 == 0x29e)) || (uVar2 == 0x2a8)) ||
                        (((((uVar2 == 0x2ad || (uVar2 == 700)) ||
                           ((uVar2 == 0x2c6 || ((uVar2 == 0x2cb || (uVar2 == 0x2d0)))))) ||
                          (uVar2 == 0x2da)) ||
                         ((((uVar2 == 0x2df || (uVar2 == 0x2e4)) || (uVar2 == 0x2ee)) ||
                          ((uVar2 == 0x2f3 || (uVar2 == 0x2f8)))))))) ||
                       (((uVar2 == 0x302 || ((uVar2 == 0x307 || (uVar2 == 0x30c)))) ||
                        (uVar2 == 0x316)))) goto LAB_001a8c69;
                    if (uVar2 == 0x31b) {
                      sVar4 = google::protobuf::internal::WireFormatLite::
                              MessageSizeNoVirtual<CoreML::Specification::GeluLayerParams>
                                        ((this->layer_).gelu_);
                    }
                    else {
                      if ((uVar2 == 0x32f) || (uVar2 == 0x334)) goto switchD_001a8cac_caseD_339;
                      if (((uVar2 == 0x348) ||
                          ((((uVar2 == 0x34d || (uVar2 == 0x352)) || (uVar2 == 0x357)) ||
                           ((uVar2 == 0x361 || (uVar2 == 0x366)))))) ||
                         ((uVar2 == 0x36b ||
                          (((uVar2 == 0x370 || (uVar2 == 0x375)) ||
                           ((uVar2 == 0x37a ||
                            (((uVar2 == 0x37f || (uVar2 == 900)) || (uVar2 == 0x389))))))))))
                      goto LAB_001a8c69;
                      if (uVar2 == 0x398) {
                        sVar4 = google::protobuf::internal::WireFormatLite::
                                MessageSizeNoVirtual<CoreML::Specification::TileLayerParams>
                                          ((this->layer_).tile_);
                      }
                      else if (uVar2 == 0x39d) {
                        sVar4 = google::protobuf::internal::WireFormatLite::
                                MessageSizeNoVirtual<CoreML::Specification::StackLayerParams>
                                          ((this->layer_).stack_);
                      }
                      else if (uVar2 == 0x3a2) {
                        sVar4 = google::protobuf::internal::WireFormatLite::
                                MessageSizeNoVirtual<CoreML::Specification::GatherLayerParams>
                                          ((this->layer_).gather_);
                      }
                      else if (uVar2 == 0x3a7) {
                        sVar4 = google::protobuf::internal::WireFormatLite::
                                MessageSizeNoVirtual<CoreML::Specification::ScatterLayerParams>
                                          ((this->layer_).scatter_);
                      }
                      else {
                        if (uVar2 == 0x3ac) goto LAB_001a8c69;
                        if (uVar2 == 0x3c0) {
                          sVar4 = google::protobuf::internal::WireFormatLite::
                                  MessageSizeNoVirtual<CoreML::Specification::ReverseLayerParams>
                                            ((this->layer_).reverse_);
                        }
                        else if (uVar2 == 0x3c5) {
                          sVar4 = google::protobuf::internal::WireFormatLite::
                                  MessageSizeNoVirtual<CoreML::Specification::ReverseSeqLayerParams>
                                            ((this->layer_).reverseseq_);
                        }
                        else if (uVar2 == 0x3cf) {
                          sVar4 = google::protobuf::internal::WireFormatLite::
                                  MessageSizeNoVirtual<CoreML::Specification::SplitNDLayerParams>
                                            ((this->layer_).splitnd_);
                        }
                        else if (uVar2 == 0x3d4) {
                          sVar4 = google::protobuf::internal::WireFormatLite::
                                  MessageSizeNoVirtual<CoreML::Specification::ConcatNDLayerParams>
                                            ((this->layer_).concatnd_);
                        }
                        else if (uVar2 == 0x3d9) {
                          sVar4 = google::protobuf::internal::WireFormatLite::
                                  MessageSizeNoVirtual<CoreML::Specification::TransposeLayerParams>
                                            ((this->layer_).transpose_);
                        }
                        else if (uVar2 == 0x3e3) {
                          sVar4 = google::protobuf::internal::WireFormatLite::
                                  MessageSizeNoVirtual<CoreML::Specification::SliceStaticLayerParams>
                                            ((this->layer_).slicestatic_);
                        }
                        else if (uVar2 == 1000) {
                          sVar4 = google::protobuf::internal::WireFormatLite::
                                  MessageSizeNoVirtual<CoreML::Specification::SliceDynamicLayerParams>
                                            ((this->layer_).slicedynamic_);
                        }
                        else if (uVar2 == 0x3ed) {
                          sVar4 = google::protobuf::internal::WireFormatLite::
                                  MessageSizeNoVirtual<CoreML::Specification::SlidingWindowsLayerParams>
                                            ((this->layer_).slidingwindows_);
                        }
                        else if (uVar2 == 0x3f7) {
                          sVar4 = google::protobuf::internal::WireFormatLite::
                                  MessageSizeNoVirtual<CoreML::Specification::TopKLayerParams>
                                            ((this->layer_).topk_);
                        }
                        else if (uVar2 == 0x3fc) {
                          sVar4 = google::protobuf::internal::WireFormatLite::
                                  MessageSizeNoVirtual<CoreML::Specification::ArgMinLayerParams>
                                            ((this->layer_).argmin_);
                        }
                        else if (uVar2 == 0x401) {
                          sVar4 = google::protobuf::internal::WireFormatLite::
                                  MessageSizeNoVirtual<CoreML::Specification::ArgMaxLayerParams>
                                            ((this->layer_).argmax_);
                        }
                        else if (uVar2 == 0x410) {
                          sVar4 = google::protobuf::internal::WireFormatLite::
                                  MessageSizeNoVirtual<CoreML::Specification::EmbeddingNDLayerParams>
                                            ((this->layer_).embeddingnd_);
                        }
                        else if (uVar2 == 0x415) {
                          sVar4 = google::protobuf::internal::WireFormatLite::
                                  MessageSizeNoVirtual<CoreML::Specification::BatchedMatMulLayerParams>
                                            ((this->layer_).batchedmatmul_);
                        }
                        else {
                          if (uVar2 == 0x429) goto LAB_001a8c69;
                          if (uVar2 == 0x42e) {
                            sVar4 = google::protobuf::internal::WireFormatLite::
                                    MessageSizeNoVirtual<CoreML::Specification::LoadConstantNDLayerParams>
                                              ((this->layer_).loadconstantnd_);
                          }
                          else {
                            if (uVar2 == 0x438) {
switchD_001a8cac_caseD_339:
                              pCVar7 = (this->layer_).convolution_;
                              uVar8 = (ulong)(-(uint)((float)(pCVar7->kernelsize_).current_size_ !=
                                                     0.0) & 1) * 5;
                              goto LAB_001a8cc9;
                            }
                            if (uVar2 == 0x43d) {
                              sVar4 = google::protobuf::internal::WireFormatLite::
                                      MessageSizeNoVirtual<CoreML::Specification::FillStaticLayerParams>
                                                ((this->layer_).fillstatic_);
                            }
                            else {
                              if (uVar2 == 0x442) goto switchD_001a8cac_caseD_339;
                              if (uVar2 == 0x44c) {
LAB_001a8c69:
                                (((this->layer_).convolution_)->kernelsize_).current_size_ = 0;
                                sVar6 = sVar6 + 3;
                                goto switchD_001a8ce6_caseD_3b2;
                              }
                              if (uVar2 == 0x451) {
                                sVar4 = google::protobuf::internal::WireFormatLite::
                                        MessageSizeNoVirtual<CoreML::Specification::BroadcastToStaticLayerParams>
                                                  ((this->layer_).broadcasttostatic_);
                              }
                              else {
                                if (uVar2 == 0x456) goto LAB_001a8c69;
                                if (uVar2 == 0x460) {
                                  sVar4 = google::protobuf::internal::WireFormatLite::
                                          MessageSizeNoVirtual<CoreML::Specification::SqueezeLayerParams>
                                                    ((this->layer_).squeeze_);
                                }
                                else if (uVar2 == 0x465) {
                                  sVar4 = google::protobuf::internal::WireFormatLite::
                                          MessageSizeNoVirtual<CoreML::Specification::ExpandDimsLayerParams>
                                                    ((this->layer_).expanddims_);
                                }
                                else if (uVar2 == 0x46a) {
                                  sVar4 = google::protobuf::internal::WireFormatLite::
                                          MessageSizeNoVirtual<CoreML::Specification::FlattenTo2DLayerParams>
                                                    ((this->layer_).flattento2d_);
                                }
                                else {
                                  if (uVar2 == 0x46f) goto LAB_001a8c69;
                                  if (uVar2 == 0x474) {
                                    sVar4 = google::protobuf::internal::WireFormatLite::
                                            MessageSizeNoVirtual<CoreML::Specification::ReshapeStaticLayerParams>
                                                      ((this->layer_).reshapestatic_);
                                  }
                                  else {
                                    if (uVar2 == 0x479) goto LAB_001a8c69;
                                    if (uVar2 == 0x47e) {
                                      sVar4 = google::protobuf::internal::WireFormatLite::
                                              MessageSizeNoVirtual<CoreML::Specification::RankPreservingReshapeLayerParams>
                                                        ((this->layer_).rankpreservingreshape_);
                                    }
                                    else if (uVar2 == 0x483) {
                                      sVar4 = google::protobuf::internal::WireFormatLite::
                                              MessageSizeNoVirtual<CoreML::Specification::ConstantPaddingLayerParams>
                                                        ((this->layer_).constantpad_);
                                    }
                                    else if (uVar2 == 0x492) {
                                      sVar4 = google::protobuf::internal::WireFormatLite::
                                              MessageSizeNoVirtual<CoreML::Specification::RandomNormalLikeLayerParams>
                                                        ((this->layer_).randomnormallike_);
                                    }
                                    else if (uVar2 == 0x497) {
                                      sVar4 = google::protobuf::internal::WireFormatLite::
                                              MessageSizeNoVirtual<CoreML::Specification::RandomNormalStaticLayerParams>
                                                        ((this->layer_).randomnormalstatic_);
                                    }
                                    else if (uVar2 == 0x49c) {
                                      sVar4 = google::protobuf::internal::WireFormatLite::
                                              MessageSizeNoVirtual<CoreML::Specification::RandomNormalDynamicLayerParams>
                                                        ((this->layer_).randomnormaldynamic_);
                                    }
                                    else if (uVar2 == 0x4a6) {
                                      sVar4 = google::protobuf::internal::WireFormatLite::
                                              MessageSizeNoVirtual<CoreML::Specification::RandomUniformLikeLayerParams>
                                                        ((this->layer_).randomuniformlike_);
                                    }
                                    else if (uVar2 == 0x4ab) {
                                      sVar4 = google::protobuf::internal::WireFormatLite::
                                              MessageSizeNoVirtual<CoreML::Specification::RandomUniformStaticLayerParams>
                                                        ((this->layer_).randomuniformstatic_);
                                    }
                                    else if (uVar2 == 0x4b0) {
                                      sVar4 = google::protobuf::internal::WireFormatLite::
                                              MessageSizeNoVirtual<CoreML::Specification::RandomUniformDynamicLayerParams>
                                                        ((this->layer_).randomuniformdynamic_);
                                    }
                                    else if (uVar2 == 0x4ba) {
                                      sVar4 = google::protobuf::internal::WireFormatLite::
                                              MessageSizeNoVirtual<CoreML::Specification::RandomBernoulliLikeLayerParams>
                                                        ((this->layer_).randombernoullilike_);
                                    }
                                    else if (uVar2 == 0x4bf) {
                                      sVar4 = google::protobuf::internal::WireFormatLite::
                                              MessageSizeNoVirtual<CoreML::Specification::RandomBernoulliStaticLayerParams>
                                                        ((this->layer_).randombernoullistatic_);
                                    }
                                    else if (uVar2 == 0x4c4) {
                                      sVar4 = google::protobuf::internal::WireFormatLite::
                                              MessageSizeNoVirtual<CoreML::Specification::RandomBernoulliDynamicLayerParams>
                                                        ((this->layer_).randombernoullidynamic_);
                                    }
                                    else if (uVar2 == 0x4ce) {
                                      sVar4 = google::protobuf::internal::WireFormatLite::
                                              MessageSizeNoVirtual<CoreML::Specification::CategoricalDistributionLayerParams>
                                                        ((this->layer_).categoricaldistribution_);
                                    }
                                    else if (uVar2 == 0x4e2) {
                                      sVar4 = google::protobuf::internal::WireFormatLite::
                                              MessageSizeNoVirtual<CoreML::Specification::ReduceL1LayerParams>
                                                        ((this->layer_).reducel1_);
                                    }
                                    else if (uVar2 == 0x4e7) {
                                      sVar4 = google::protobuf::internal::WireFormatLite::
                                              MessageSizeNoVirtual<CoreML::Specification::ReduceL2LayerParams>
                                                        ((this->layer_).reducel2_);
                                    }
                                    else if (uVar2 == 0x4ec) {
                                      sVar4 = google::protobuf::internal::WireFormatLite::
                                              MessageSizeNoVirtual<CoreML::Specification::ReduceMaxLayerParams>
                                                        ((this->layer_).reducemax_);
                                    }
                                    else if (uVar2 == 0x4f1) {
                                      sVar4 = google::protobuf::internal::WireFormatLite::
                                              MessageSizeNoVirtual<CoreML::Specification::ReduceMinLayerParams>
                                                        ((this->layer_).reducemin_);
                                    }
                                    else if (uVar2 == 0x4f6) {
                                      sVar4 = google::protobuf::internal::WireFormatLite::
                                              MessageSizeNoVirtual<CoreML::Specification::ReduceSumLayerParams>
                                                        ((this->layer_).reducesum_);
                                    }
                                    else if (uVar2 == 0x4fb) {
                                      sVar4 = google::protobuf::internal::WireFormatLite::
                                              MessageSizeNoVirtual<CoreML::Specification::ReduceProdLayerParams>
                                                        ((this->layer_).reduceprod_);
                                    }
                                    else if (uVar2 == 0x500) {
                                      sVar4 = google::protobuf::internal::WireFormatLite::
                                              MessageSizeNoVirtual<CoreML::Specification::ReduceMeanLayerParams>
                                                        ((this->layer_).reducemean_);
                                    }
                                    else if (uVar2 == 0x505) {
                                      sVar4 = google::protobuf::internal::WireFormatLite::
                                              MessageSizeNoVirtual<CoreML::Specification::ReduceLogSumLayerParams>
                                                        ((this->layer_).reducelogsum_);
                                    }
                                    else if (uVar2 == 0x50a) {
                                      sVar4 = google::protobuf::internal::WireFormatLite::
                                              MessageSizeNoVirtual<CoreML::Specification::ReduceSumSquareLayerParams>
                                                        ((this->layer_).reducesumsquare_);
                                    }
                                    else if (uVar2 == 0x50f) {
                                      sVar4 = google::protobuf::internal::WireFormatLite::
                                              MessageSizeNoVirtual<CoreML::Specification::ReduceLogSumExpLayerParams>
                                                        ((this->layer_).reducelogsumexp_);
                                    }
                                    else {
                                      if (uVar2 == 0x521) goto LAB_001a8c69;
                                      if (uVar2 == 0x523) {
                                        sVar4 = google::protobuf::internal::WireFormatLite::
                                                MessageSizeNoVirtual<CoreML::Specification::MatrixBandPartLayerParams>
                                                          ((this->layer_).matrixbandpart_);
                                      }
                                      else if (uVar2 == 0x528) {
                                        sVar4 = google::protobuf::internal::WireFormatLite::
                                                MessageSizeNoVirtual<CoreML::Specification::LowerTriangularLayerParams>
                                                          ((this->layer_).lowertriangular_);
                                      }
                                      else if (uVar2 == 0x52d) {
                                        sVar4 = google::protobuf::internal::WireFormatLite::
                                                MessageSizeNoVirtual<CoreML::Specification::UpperTriangularLayerParams>
                                                          ((this->layer_).uppertriangular_);
                                      }
                                      else {
                                        if (uVar2 == 0x532) goto LAB_001a8c69;
                                        if (uVar2 == 0x546) {
                                          sVar4 = google::protobuf::internal::WireFormatLite::
                                                  MessageSizeNoVirtual<CoreML::Specification::LayerNormalizationLayerParams>
                                                            ((this->layer_).layernormalization_);
                                        }
                                        else if (uVar2 == 0x578) {
                                          sVar4 = google::protobuf::internal::WireFormatLite::
                                                  MessageSizeNoVirtual<CoreML::Specification::NonMaximumSuppressionLayerParams>
                                                            ((this->layer_).nonmaximumsuppression_);
                                        }
                                        else {
                                          if (uVar2 != 100) goto switchD_001a8ce6_caseD_3b2;
                                          sVar4 = google::protobuf::internal::WireFormatLite::
                                                  MessageSizeNoVirtual<CoreML::Specification::ConvolutionLayerParams>
                                                            ((this->layer_).convolution_);
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  sVar6 = sVar6 + sVar4 + 2;
switchD_001a8ce6_caseD_3b2:
  this->_cached_size_ = (int)sVar6;
  return sVar6;
}

Assistant:

size_t NeuralNetworkLayer::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.NeuralNetworkLayer)
  size_t total_size = 0;

  // repeated string input = 2;
  total_size += 1 *
      ::google::protobuf::internal::FromIntSize(this->input_size());
  for (int i = 0, n = this->input_size(); i < n; i++) {
    total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
      this->input(i));
  }

  // repeated string output = 3;
  total_size += 1 *
      ::google::protobuf::internal::FromIntSize(this->output_size());
  for (int i = 0, n = this->output_size(); i < n; i++) {
    total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
      this->output(i));
  }

  // repeated .CoreML.Specification.Tensor inputTensor = 4;
  {
    unsigned int count = this->inputtensor_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->inputtensor(i));
    }
  }

  // repeated .CoreML.Specification.Tensor outputTensor = 5;
  {
    unsigned int count = this->outputtensor_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->outputtensor(i));
    }
  }

  // string name = 1;
  if (this->name().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->name());
  }

  // bool isUpdatable = 10;
  if (this->isupdatable() != 0) {
    total_size += 1 + 1;
  }

  switch (layer_case()) {
    // .CoreML.Specification.ConvolutionLayerParams convolution = 100;
    case kConvolution: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.convolution_);
      break;
    }
    // .CoreML.Specification.PoolingLayerParams pooling = 120;
    case kPooling: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.pooling_);
      break;
    }
    // .CoreML.Specification.ActivationParams activation = 130;
    case kActivation: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.activation_);
      break;
    }
    // .CoreML.Specification.InnerProductLayerParams innerProduct = 140;
    case kInnerProduct: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.innerproduct_);
      break;
    }
    // .CoreML.Specification.EmbeddingLayerParams embedding = 150;
    case kEmbedding: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.embedding_);
      break;
    }
    // .CoreML.Specification.BatchnormLayerParams batchnorm = 160;
    case kBatchnorm: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.batchnorm_);
      break;
    }
    // .CoreML.Specification.MeanVarianceNormalizeLayerParams mvn = 165;
    case kMvn: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.mvn_);
      break;
    }
    // .CoreML.Specification.L2NormalizeLayerParams l2normalize = 170;
    case kL2Normalize: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.l2normalize_);
      break;
    }
    // .CoreML.Specification.SoftmaxLayerParams softmax = 175;
    case kSoftmax: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.softmax_);
      break;
    }
    // .CoreML.Specification.LRNLayerParams lrn = 180;
    case kLrn: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.lrn_);
      break;
    }
    // .CoreML.Specification.CropLayerParams crop = 190;
    case kCrop: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.crop_);
      break;
    }
    // .CoreML.Specification.PaddingLayerParams padding = 200;
    case kPadding: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.padding_);
      break;
    }
    // .CoreML.Specification.UpsampleLayerParams upsample = 210;
    case kUpsample: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.upsample_);
      break;
    }
    // .CoreML.Specification.ResizeBilinearLayerParams resizeBilinear = 211;
    case kResizeBilinear: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.resizebilinear_);
      break;
    }
    // .CoreML.Specification.CropResizeLayerParams cropResize = 212;
    case kCropResize: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.cropresize_);
      break;
    }
    // .CoreML.Specification.UnaryFunctionLayerParams unary = 220;
    case kUnary: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.unary_);
      break;
    }
    // .CoreML.Specification.AddLayerParams add = 230;
    case kAdd: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.add_);
      break;
    }
    // .CoreML.Specification.MultiplyLayerParams multiply = 231;
    case kMultiply: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.multiply_);
      break;
    }
    // .CoreML.Specification.AverageLayerParams average = 240;
    case kAverage: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.average_);
      break;
    }
    // .CoreML.Specification.ScaleLayerParams scale = 245;
    case kScale: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.scale_);
      break;
    }
    // .CoreML.Specification.BiasLayerParams bias = 250;
    case kBias: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.bias_);
      break;
    }
    // .CoreML.Specification.MaxLayerParams max = 260;
    case kMax: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.max_);
      break;
    }
    // .CoreML.Specification.MinLayerParams min = 261;
    case kMin: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.min_);
      break;
    }
    // .CoreML.Specification.DotProductLayerParams dot = 270;
    case kDot: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.dot_);
      break;
    }
    // .CoreML.Specification.ReduceLayerParams reduce = 280;
    case kReduce: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reduce_);
      break;
    }
    // .CoreML.Specification.LoadConstantLayerParams loadConstant = 290;
    case kLoadConstant: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.loadconstant_);
      break;
    }
    // .CoreML.Specification.ReshapeLayerParams reshape = 300;
    case kReshape: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reshape_);
      break;
    }
    // .CoreML.Specification.FlattenLayerParams flatten = 301;
    case kFlatten: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.flatten_);
      break;
    }
    // .CoreML.Specification.PermuteLayerParams permute = 310;
    case kPermute: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.permute_);
      break;
    }
    // .CoreML.Specification.ConcatLayerParams concat = 320;
    case kConcat: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.concat_);
      break;
    }
    // .CoreML.Specification.SplitLayerParams split = 330;
    case kSplit: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.split_);
      break;
    }
    // .CoreML.Specification.SequenceRepeatLayerParams sequenceRepeat = 340;
    case kSequenceRepeat: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.sequencerepeat_);
      break;
    }
    // .CoreML.Specification.ReorganizeDataLayerParams reorganizeData = 345;
    case kReorganizeData: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reorganizedata_);
      break;
    }
    // .CoreML.Specification.SliceLayerParams slice = 350;
    case kSlice: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.slice_);
      break;
    }
    // .CoreML.Specification.SimpleRecurrentLayerParams simpleRecurrent = 400;
    case kSimpleRecurrent: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.simplerecurrent_);
      break;
    }
    // .CoreML.Specification.GRULayerParams gru = 410;
    case kGru: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.gru_);
      break;
    }
    // .CoreML.Specification.UniDirectionalLSTMLayerParams uniDirectionalLSTM = 420;
    case kUniDirectionalLSTM: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.unidirectionallstm_);
      break;
    }
    // .CoreML.Specification.BiDirectionalLSTMLayerParams biDirectionalLSTM = 430;
    case kBiDirectionalLSTM: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.bidirectionallstm_);
      break;
    }
    // .CoreML.Specification.CustomLayerParams custom = 500;
    case kCustom: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.custom_);
      break;
    }
    // .CoreML.Specification.CopyLayerParams copy = 600;
    case kCopy: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.copy_);
      break;
    }
    // .CoreML.Specification.BranchLayerParams branch = 605;
    case kBranch: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.branch_);
      break;
    }
    // .CoreML.Specification.LoopLayerParams loop = 615;
    case kLoop: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.loop_);
      break;
    }
    // .CoreML.Specification.LoopBreakLayerParams loopBreak = 620;
    case kLoopBreak: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.loopbreak_);
      break;
    }
    // .CoreML.Specification.LoopContinueLayerParams loopContinue = 625;
    case kLoopContinue: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.loopcontinue_);
      break;
    }
    // .CoreML.Specification.RangeStaticLayerParams rangeStatic = 635;
    case kRangeStatic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.rangestatic_);
      break;
    }
    // .CoreML.Specification.RangeDynamicLayerParams rangeDynamic = 640;
    case kRangeDynamic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.rangedynamic_);
      break;
    }
    // .CoreML.Specification.ClipLayerParams clip = 660;
    case kClip: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.clip_);
      break;
    }
    // .CoreML.Specification.CeilLayerParams ceil = 665;
    case kCeil: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.ceil_);
      break;
    }
    // .CoreML.Specification.FloorLayerParams floor = 670;
    case kFloor: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.floor_);
      break;
    }
    // .CoreML.Specification.SignLayerParams sign = 680;
    case kSign: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.sign_);
      break;
    }
    // .CoreML.Specification.RoundLayerParams round = 685;
    case kRound: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.round_);
      break;
    }
    // .CoreML.Specification.Exp2LayerParams exp2 = 700;
    case kExp2: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.exp2_);
      break;
    }
    // .CoreML.Specification.SinLayerParams sin = 710;
    case kSin: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.sin_);
      break;
    }
    // .CoreML.Specification.CosLayerParams cos = 715;
    case kCos: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.cos_);
      break;
    }
    // .CoreML.Specification.TanLayerParams tan = 720;
    case kTan: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.tan_);
      break;
    }
    // .CoreML.Specification.AsinLayerParams asin = 730;
    case kAsin: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.asin_);
      break;
    }
    // .CoreML.Specification.AcosLayerParams acos = 735;
    case kAcos: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.acos_);
      break;
    }
    // .CoreML.Specification.AtanLayerParams atan = 740;
    case kAtan: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.atan_);
      break;
    }
    // .CoreML.Specification.SinhLayerParams sinh = 750;
    case kSinh: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.sinh_);
      break;
    }
    // .CoreML.Specification.CoshLayerParams cosh = 755;
    case kCosh: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.cosh_);
      break;
    }
    // .CoreML.Specification.TanhLayerParams tanh = 760;
    case kTanh: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.tanh_);
      break;
    }
    // .CoreML.Specification.AsinhLayerParams asinh = 770;
    case kAsinh: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.asinh_);
      break;
    }
    // .CoreML.Specification.AcoshLayerParams acosh = 775;
    case kAcosh: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.acosh_);
      break;
    }
    // .CoreML.Specification.AtanhLayerParams atanh = 780;
    case kAtanh: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.atanh_);
      break;
    }
    // .CoreML.Specification.ErfLayerParams erf = 790;
    case kErf: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.erf_);
      break;
    }
    // .CoreML.Specification.GeluLayerParams gelu = 795;
    case kGelu: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.gelu_);
      break;
    }
    // .CoreML.Specification.EqualLayerParams equal = 815;
    case kEqual: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.equal_);
      break;
    }
    // .CoreML.Specification.NotEqualLayerParams notEqual = 820;
    case kNotEqual: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.notequal_);
      break;
    }
    // .CoreML.Specification.LessThanLayerParams lessThan = 825;
    case kLessThan: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.lessthan_);
      break;
    }
    // .CoreML.Specification.LessEqualLayerParams lessEqual = 827;
    case kLessEqual: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.lessequal_);
      break;
    }
    // .CoreML.Specification.GreaterThanLayerParams greaterThan = 830;
    case kGreaterThan: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.greaterthan_);
      break;
    }
    // .CoreML.Specification.GreaterEqualLayerParams greaterEqual = 832;
    case kGreaterEqual: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.greaterequal_);
      break;
    }
    // .CoreML.Specification.LogicalOrLayerParams logicalOr = 840;
    case kLogicalOr: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.logicalor_);
      break;
    }
    // .CoreML.Specification.LogicalXorLayerParams logicalXor = 845;
    case kLogicalXor: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.logicalxor_);
      break;
    }
    // .CoreML.Specification.LogicalNotLayerParams logicalNot = 850;
    case kLogicalNot: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.logicalnot_);
      break;
    }
    // .CoreML.Specification.LogicalAndLayerParams logicalAnd = 855;
    case kLogicalAnd: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.logicaland_);
      break;
    }
    // .CoreML.Specification.ModBroadcastableLayerParams modBroadcastable = 865;
    case kModBroadcastable: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.modbroadcastable_);
      break;
    }
    // .CoreML.Specification.MinBroadcastableLayerParams minBroadcastable = 870;
    case kMinBroadcastable: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.minbroadcastable_);
      break;
    }
    // .CoreML.Specification.MaxBroadcastableLayerParams maxBroadcastable = 875;
    case kMaxBroadcastable: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.maxbroadcastable_);
      break;
    }
    // .CoreML.Specification.AddBroadcastableLayerParams addBroadcastable = 880;
    case kAddBroadcastable: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.addbroadcastable_);
      break;
    }
    // .CoreML.Specification.PowBroadcastableLayerParams powBroadcastable = 885;
    case kPowBroadcastable: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.powbroadcastable_);
      break;
    }
    // .CoreML.Specification.DivideBroadcastableLayerParams divideBroadcastable = 890;
    case kDivideBroadcastable: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.dividebroadcastable_);
      break;
    }
    // .CoreML.Specification.FloorDivBroadcastableLayerParams floorDivBroadcastable = 895;
    case kFloorDivBroadcastable: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.floordivbroadcastable_);
      break;
    }
    // .CoreML.Specification.MultiplyBroadcastableLayerParams multiplyBroadcastable = 900;
    case kMultiplyBroadcastable: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.multiplybroadcastable_);
      break;
    }
    // .CoreML.Specification.SubtractBroadcastableLayerParams subtractBroadcastable = 905;
    case kSubtractBroadcastable: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.subtractbroadcastable_);
      break;
    }
    // .CoreML.Specification.TileLayerParams tile = 920;
    case kTile: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.tile_);
      break;
    }
    // .CoreML.Specification.StackLayerParams stack = 925;
    case kStack: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.stack_);
      break;
    }
    // .CoreML.Specification.GatherLayerParams gather = 930;
    case kGather: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.gather_);
      break;
    }
    // .CoreML.Specification.ScatterLayerParams scatter = 935;
    case kScatter: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.scatter_);
      break;
    }
    // .CoreML.Specification.GatherNDLayerParams gatherND = 940;
    case kGatherND: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.gathernd_);
      break;
    }
    // .CoreML.Specification.ScatterNDLayerParams scatterND = 945;
    case kScatterND: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.scatternd_);
      break;
    }
    // .CoreML.Specification.SoftmaxNDLayerParams softmaxND = 950;
    case kSoftmaxND: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.softmaxnd_);
      break;
    }
    // .CoreML.Specification.GatherAlongAxisLayerParams gatherAlongAxis = 952;
    case kGatherAlongAxis: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.gatheralongaxis_);
      break;
    }
    // .CoreML.Specification.ScatterAlongAxisLayerParams scatterAlongAxis = 954;
    case kScatterAlongAxis: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.scatteralongaxis_);
      break;
    }
    // .CoreML.Specification.ReverseLayerParams reverse = 960;
    case kReverse: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reverse_);
      break;
    }
    // .CoreML.Specification.ReverseSeqLayerParams reverseSeq = 965;
    case kReverseSeq: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reverseseq_);
      break;
    }
    // .CoreML.Specification.SplitNDLayerParams splitND = 975;
    case kSplitND: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.splitnd_);
      break;
    }
    // .CoreML.Specification.ConcatNDLayerParams concatND = 980;
    case kConcatND: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.concatnd_);
      break;
    }
    // .CoreML.Specification.TransposeLayerParams transpose = 985;
    case kTranspose: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.transpose_);
      break;
    }
    // .CoreML.Specification.SliceStaticLayerParams sliceStatic = 995;
    case kSliceStatic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.slicestatic_);
      break;
    }
    // .CoreML.Specification.SliceDynamicLayerParams sliceDynamic = 1000;
    case kSliceDynamic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.slicedynamic_);
      break;
    }
    // .CoreML.Specification.SlidingWindowsLayerParams slidingWindows = 1005;
    case kSlidingWindows: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.slidingwindows_);
      break;
    }
    // .CoreML.Specification.TopKLayerParams topK = 1015;
    case kTopK: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.topk_);
      break;
    }
    // .CoreML.Specification.ArgMinLayerParams argMin = 1020;
    case kArgMin: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.argmin_);
      break;
    }
    // .CoreML.Specification.ArgMaxLayerParams argMax = 1025;
    case kArgMax: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.argmax_);
      break;
    }
    // .CoreML.Specification.EmbeddingNDLayerParams embeddingND = 1040;
    case kEmbeddingND: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.embeddingnd_);
      break;
    }
    // .CoreML.Specification.BatchedMatMulLayerParams batchedMatmul = 1045;
    case kBatchedMatmul: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.batchedmatmul_);
      break;
    }
    // .CoreML.Specification.GetShapeLayerParams getShape = 1065;
    case kGetShape: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.getshape_);
      break;
    }
    // .CoreML.Specification.LoadConstantNDLayerParams loadConstantND = 1070;
    case kLoadConstantND: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.loadconstantnd_);
      break;
    }
    // .CoreML.Specification.FillLikeLayerParams fillLike = 1080;
    case kFillLike: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.filllike_);
      break;
    }
    // .CoreML.Specification.FillStaticLayerParams fillStatic = 1085;
    case kFillStatic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.fillstatic_);
      break;
    }
    // .CoreML.Specification.FillDynamicLayerParams fillDynamic = 1090;
    case kFillDynamic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.filldynamic_);
      break;
    }
    // .CoreML.Specification.BroadcastToLikeLayerParams broadcastToLike = 1100;
    case kBroadcastToLike: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.broadcasttolike_);
      break;
    }
    // .CoreML.Specification.BroadcastToStaticLayerParams broadcastToStatic = 1105;
    case kBroadcastToStatic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.broadcasttostatic_);
      break;
    }
    // .CoreML.Specification.BroadcastToDynamicLayerParams broadcastToDynamic = 1110;
    case kBroadcastToDynamic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.broadcasttodynamic_);
      break;
    }
    // .CoreML.Specification.SqueezeLayerParams squeeze = 1120;
    case kSqueeze: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.squeeze_);
      break;
    }
    // .CoreML.Specification.ExpandDimsLayerParams expandDims = 1125;
    case kExpandDims: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.expanddims_);
      break;
    }
    // .CoreML.Specification.FlattenTo2DLayerParams flattenTo2D = 1130;
    case kFlattenTo2D: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.flattento2d_);
      break;
    }
    // .CoreML.Specification.ReshapeLikeLayerParams reshapeLike = 1135;
    case kReshapeLike: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reshapelike_);
      break;
    }
    // .CoreML.Specification.ReshapeStaticLayerParams reshapeStatic = 1140;
    case kReshapeStatic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reshapestatic_);
      break;
    }
    // .CoreML.Specification.ReshapeDynamicLayerParams reshapeDynamic = 1145;
    case kReshapeDynamic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reshapedynamic_);
      break;
    }
    // .CoreML.Specification.RankPreservingReshapeLayerParams rankPreservingReshape = 1150;
    case kRankPreservingReshape: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.rankpreservingreshape_);
      break;
    }
    // .CoreML.Specification.ConstantPaddingLayerParams constantPad = 1155;
    case kConstantPad: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.constantpad_);
      break;
    }
    // .CoreML.Specification.RandomNormalLikeLayerParams randomNormalLike = 1170;
    case kRandomNormalLike: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.randomnormallike_);
      break;
    }
    // .CoreML.Specification.RandomNormalStaticLayerParams randomNormalStatic = 1175;
    case kRandomNormalStatic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.randomnormalstatic_);
      break;
    }
    // .CoreML.Specification.RandomNormalDynamicLayerParams randomNormalDynamic = 1180;
    case kRandomNormalDynamic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.randomnormaldynamic_);
      break;
    }
    // .CoreML.Specification.RandomUniformLikeLayerParams randomUniformLike = 1190;
    case kRandomUniformLike: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.randomuniformlike_);
      break;
    }
    // .CoreML.Specification.RandomUniformStaticLayerParams randomUniformStatic = 1195;
    case kRandomUniformStatic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.randomuniformstatic_);
      break;
    }
    // .CoreML.Specification.RandomUniformDynamicLayerParams randomUniformDynamic = 1200;
    case kRandomUniformDynamic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.randomuniformdynamic_);
      break;
    }
    // .CoreML.Specification.RandomBernoulliLikeLayerParams randomBernoulliLike = 1210;
    case kRandomBernoulliLike: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.randombernoullilike_);
      break;
    }
    // .CoreML.Specification.RandomBernoulliStaticLayerParams randomBernoulliStatic = 1215;
    case kRandomBernoulliStatic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.randombernoullistatic_);
      break;
    }
    // .CoreML.Specification.RandomBernoulliDynamicLayerParams randomBernoulliDynamic = 1220;
    case kRandomBernoulliDynamic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.randombernoullidynamic_);
      break;
    }
    // .CoreML.Specification.CategoricalDistributionLayerParams categoricalDistribution = 1230;
    case kCategoricalDistribution: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.categoricaldistribution_);
      break;
    }
    // .CoreML.Specification.ReduceL1LayerParams reduceL1 = 1250;
    case kReduceL1: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reducel1_);
      break;
    }
    // .CoreML.Specification.ReduceL2LayerParams reduceL2 = 1255;
    case kReduceL2: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reducel2_);
      break;
    }
    // .CoreML.Specification.ReduceMaxLayerParams reduceMax = 1260;
    case kReduceMax: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reducemax_);
      break;
    }
    // .CoreML.Specification.ReduceMinLayerParams reduceMin = 1265;
    case kReduceMin: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reducemin_);
      break;
    }
    // .CoreML.Specification.ReduceSumLayerParams reduceSum = 1270;
    case kReduceSum: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reducesum_);
      break;
    }
    // .CoreML.Specification.ReduceProdLayerParams reduceProd = 1275;
    case kReduceProd: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reduceprod_);
      break;
    }
    // .CoreML.Specification.ReduceMeanLayerParams reduceMean = 1280;
    case kReduceMean: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reducemean_);
      break;
    }
    // .CoreML.Specification.ReduceLogSumLayerParams reduceLogSum = 1285;
    case kReduceLogSum: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reducelogsum_);
      break;
    }
    // .CoreML.Specification.ReduceSumSquareLayerParams reduceSumSquare = 1290;
    case kReduceSumSquare: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reducesumsquare_);
      break;
    }
    // .CoreML.Specification.ReduceLogSumExpLayerParams reduceLogSumExp = 1295;
    case kReduceLogSumExp: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reducelogsumexp_);
      break;
    }
    // .CoreML.Specification.WhereNonZeroLayerParams whereNonZero = 1313;
    case kWhereNonZero: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.wherenonzero_);
      break;
    }
    // .CoreML.Specification.MatrixBandPartLayerParams matrixBandPart = 1315;
    case kMatrixBandPart: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.matrixbandpart_);
      break;
    }
    // .CoreML.Specification.LowerTriangularLayerParams lowerTriangular = 1320;
    case kLowerTriangular: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.lowertriangular_);
      break;
    }
    // .CoreML.Specification.UpperTriangularLayerParams upperTriangular = 1325;
    case kUpperTriangular: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.uppertriangular_);
      break;
    }
    // .CoreML.Specification.WhereBroadcastableLayerParams whereBroadcastable = 1330;
    case kWhereBroadcastable: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.wherebroadcastable_);
      break;
    }
    // .CoreML.Specification.LayerNormalizationLayerParams layerNormalization = 1350;
    case kLayerNormalization: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.layernormalization_);
      break;
    }
    // .CoreML.Specification.NonMaximumSuppressionLayerParams NonMaximumSuppression = 1400;
    case kNonMaximumSuppression: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.nonmaximumsuppression_);
      break;
    }
    // .CoreML.Specification.OneHotLayerParams oneHot = 1450;
    case kOneHot: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.onehot_);
      break;
    }
    // .CoreML.Specification.CumSumLayerParams cumSum = 1455;
    case kCumSum: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.cumsum_);
      break;
    }
    // .CoreML.Specification.ClampedReLULayerParams clampedReLU = 1460;
    case kClampedReLU: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.clampedrelu_);
      break;
    }
    // .CoreML.Specification.ArgSortLayerParams argSort = 1461;
    case kArgSort: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.argsort_);
      break;
    }
    // .CoreML.Specification.Pooling3DLayerParams pooling3d = 1465;
    case kPooling3D: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.pooling3d_);
      break;
    }
    // .CoreML.Specification.GlobalPooling3DLayerParams globalPooling3d = 1466;
    case kGlobalPooling3D: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.globalpooling3d_);
      break;
    }
    // .CoreML.Specification.SliceBySizeLayerParams sliceBySize = 1470;
    case kSliceBySize: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.slicebysize_);
      break;
    }
    // .CoreML.Specification.Convolution3DLayerParams convolution3d = 1471;
    case kConvolution3D: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.convolution3d_);
      break;
    }
    case LAYER_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}